

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void quantize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1f8;
  FastText fasttext;
  Args a;
  
  ::fasttext::Args::Args(&a);
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    printQuantizeUsage();
    ::fasttext::Args::printHelp(&a);
    exit(1);
  }
  ::fasttext::Args::parseArgs(&a,args);
  ::fasttext::FastText::FastText(&fasttext);
  std::operator+(&bStack_1f8,&a.output,".bin");
  ::fasttext::FastText::loadModel(&fasttext,&bStack_1f8);
  std::__cxx11::string::~string((string *)&bStack_1f8);
  ::fasttext::FastText::quantize(&fasttext,&a);
  std::operator+(&bStack_1f8,&a.output,".ftz");
  ::fasttext::FastText::saveModel(&fasttext,&bStack_1f8);
  std::__cxx11::string::~string((string *)&bStack_1f8);
  exit(0);
}

Assistant:

void quantize(const std::vector<std::string>& args) {
  Args a = Args();
  if (args.size() < 3) {
    printQuantizeUsage();
    a.printHelp();
    exit(EXIT_FAILURE);
  }
  a.parseArgs(args);
  FastText fasttext;
  // parseArgs checks if a->output is given.
  fasttext.loadModel(a.output + ".bin");
  fasttext.quantize(a);
  fasttext.saveModel(a.output + ".ftz");
  exit(0);
}